

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::GBufferFilm::GBufferFilm
          (GBufferFilm *this,FilmBaseParameters *p,RGBColorSpace *colorSpace,Float maxComponentValue
          ,bool writeFP16,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  Bounds2<int> *this_00;
  byte in_CL;
  undefined8 in_RDX;
  long in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  Float FVar3;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  FilmBaseParameters *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined1 local_b4 [20];
  char (*in_stack_ffffffffffffff60) [23];
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  LogLevel in_stack_ffffffffffffff84;
  FilmBaseParameters *in_stack_ffffffffffffff88;
  FilmBase *in_stack_ffffffffffffff90;
  SquareMatrix<3> *in_stack_ffffffffffffff98;
  SquareMatrix<3> *in_stack_ffffffffffffffa0;
  
  iVar2 = (int)((ulong)in_R8 >> 0x20);
  FilmBaseParameters::FilmBaseParameters
            (in_stack_ffffffffffffff20,
             (FilmBaseParameters *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  FilmBase::FilmBase(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x6d6a22);
  Array2D<pbrt::GBufferFilm::Pixel>::Array2D
            ((Array2D<pbrt::GBufferFilm::Pixel> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (Bounds2i *)in_stack_ffffffffffffff20,(memory_resource *)(in_RDI + 0x50));
  *(undefined8 *)(in_RDI + 0x70) = in_RDX;
  *(undefined4 *)(in_RDI + 0x78) = in_XMM0_Da;
  *(byte *)(in_RDI + 0x7c) = in_CL & 1;
  this_00 = (Bounds2<int> *)(in_RDI + 0x80);
  FVar3 = FilterHandle::Integral((FilterHandle *)this_00);
  *(Float *)&((TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
               *)&this_00->pMin)->bits = FVar3;
  SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)(in_RDI + 0x84));
  bVar1 = Bounds2<int>::IsEmpty((Bounds2<int> *)(in_RDI + 8));
  if (!bVar1) {
    iVar2 = Bounds2<int>::Area(this_00);
    *(long *)(in_FS_OFFSET + -0x558) = *(long *)(in_FS_OFFSET + -0x558) + (long)iVar2 * 0xb0;
    pbrt::operator*(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    memcpy((void *)(in_RDI + 0x84),local_b4,0x24);
    return;
  }
  LogFatal<char_const(&)[23]>
            (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,iVar2,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
}

Assistant:

GBufferFilm::GBufferFilm(FilmBaseParameters p, const RGBColorSpace *colorSpace,
                         Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      pixels(pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16),
      filterIntegral(filter.Integral()) {
    CHECK(!pixelBounds.IsEmpty());
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}